

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppm_image.hpp
# Opt level: O3

void __thiscall sisl::utility::ppm_image::ppm_image(ppm_image *this,int *width,int *height)

{
  double *pdVar1;
  double dVar2;
  int iVar3;
  double *__ptr;
  DenseStorage<double,__1,__1,_1,_0> *this_00;
  undefined8 *puVar4;
  uint d0;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  
  array_n<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_2,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::array_n(&this->m_aArray,*width,(ulong)(uint)*height);
  this->m_iHeight = *height;
  iVar7 = *width;
  this->m_iWidth = iVar7;
  __ptr = (double *)malloc(0x18);
  if (((ulong)__ptr & 0xf) != 0) {
    __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                  ,"/usr/include/eigen3/Eigen/src/Core/util/Memory.h",0xb9,
                  "void *Eigen::internal::aligned_malloc(std::size_t)");
  }
  if (__ptr != (double *)0x0) {
    *__ptr = 0.0;
    __ptr[1] = 0.0;
    __ptr[2] = 0.0;
    if (0 < iVar7) {
      iVar3 = *height;
      d0 = 0;
      do {
        if (0 < iVar3) {
          uVar6 = 0;
          do {
            this_00 = (DenseStorage<double,__1,__1,_1,_0> *)
                      array_n<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_2,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
                      ::operator()(&this->m_aArray,d0,uVar6);
            if (this_00->m_rows != 3) {
              Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize(this_00,3,3,1);
              if (this_00->m_rows != 3) {
                __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                              "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,
                              "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, 1>, T1 = double, T2 = double]"
                             );
              }
            }
            pdVar1 = this_00->m_data;
            dVar2 = __ptr[1];
            *pdVar1 = *__ptr;
            pdVar1[1] = dVar2;
            pdVar1[2] = __ptr[2];
            uVar5 = (int)uVar6 + 1;
            uVar6 = (ulong)uVar5;
            iVar3 = *height;
          } while ((int)uVar5 < iVar3);
          iVar7 = *width;
        }
        d0 = d0 + 1;
      } while ((int)d0 < iVar7);
    }
    free(__ptr);
    return;
  }
  puVar4 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar4 = std::ios::widen;
  __cxa_throw(puVar4,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

ppm_image(const int &width, const int &height) : m_iHeight(height),
                                                             m_iWidth(width),
                                                             m_aArray(width, height) {
                // Clear out the internal memory
                vector z(3);
                z.setZero();

                for(int i = 0; i < width; i++) {
                    for(int j = 0; j < height; j++) {
                        m_aArray(i,j) = z;
                    }
                }
            }